

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O1

int32_t ucnv_extMatchFromU(int32_t *cx,UChar32 firstCP,UChar *pre,int32_t preLength,UChar *src,
                          int32_t srcLength,uint32_t *pMatchValue,UBool useFallback,UBool flush)

{
  ushort uVar1;
  UChar UVar2;
  long lVar3;
  int iVar4;
  int32_t iVar5;
  UChar *pUVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int local_44;
  uint local_40;
  
  iVar5 = 0;
  if (((cx != (int32_t *)0x0) && (firstCP >> 10 < cx[0xb])) &&
     (uVar13 = *(uint *)((long)cx +
                        (ulong)*(ushort *)
                                ((long)cx +
                                (ulong)((firstCP & 0xfU) +
                                       (uint)*(ushort *)
                                              ((long)cx +
                                              (ulong)(((uint)firstCP >> 4 & 0x3f) +
                                                     (uint)*(ushort *)
                                                            ((long)cx +
                                                            (long)(firstCP >> 10) * 2 + (long)cx[10]
                                                            )) * 2 + (long)cx[10]) * 4) * 2 +
                                (long)cx[0xd]) * 4 + (long)cx[0xf]), uVar13 != 0)) {
    if (uVar13 < 0x1f0000) {
      local_40 = 0;
      iVar8 = 0;
      local_44 = 0;
      iVar9 = 0;
      do {
        uVar11 = (ulong)uVar13;
        uVar13 = *(uint *)((long)cx + uVar11 * 4 + (long)cx[6]);
        if (uVar13 != 0) {
          if (((uVar13 >> 0x1d & 1) == 0) &&
             ((0xfffdffff < firstCP - 0x110000U ||
              (0xffffe6ff < firstCP - 0xf900U || useFallback != '\0')) || 0x3fffffff < uVar13)) {
            local_44 = iVar8 + iVar9 + 2;
            local_40 = uVar13;
          }
        }
        uVar1 = *(ushort *)((long)cx + uVar11 * 2 + (long)cx[5]);
        uVar13 = (uint)uVar1;
        if (iVar9 < preLength) {
          pUVar6 = pre;
          iVar4 = iVar8;
          iVar10 = iVar9 + 1;
        }
        else {
          if (srcLength <= iVar8) {
            if ((flush == '\0') && (iVar8 + iVar9 < 0x14)) {
              return -2 - (iVar8 + iVar9);
            }
            goto LAB_001b8284;
          }
          pUVar6 = src;
          iVar4 = iVar8 + 1;
          iVar10 = iVar9;
          iVar9 = iVar8;
        }
        iVar8 = iVar4;
        lVar3 = uVar11 * 2 + (long)cx[5] + 2;
        UVar2 = pUVar6[iVar9];
        uVar7 = 0;
        uVar12 = (uint)uVar1;
        if (1 < uVar1) {
          uVar7 = 0;
          do {
            iVar9 = (int)uVar7;
            if (uVar13 < 5) {
              if ((ushort)*(UChar *)((long)cx + (long)iVar9 * 2 + lVar3) < (ushort)UVar2) {
                uVar13 = iVar9 + 1;
                if ((((int)uVar13 < (int)uVar12) &&
                    ((ushort)UVar2 <= (ushort)*(UChar *)((long)cx + (long)(int)uVar13 * 2 + lVar3)))
                   || ((uVar13 = iVar9 + 2, (int)uVar13 < (int)uVar12 &&
                       ((ushort)UVar2 <=
                        (ushort)*(UChar *)((long)cx + (long)(int)uVar13 * 2 + lVar3))))) {
                  uVar7 = (ulong)uVar13;
                }
                else {
                  uVar7 = (ulong)(iVar9 + 3);
                }
              }
              break;
            }
            uVar13 = (int)(uVar12 + iVar9) / 2;
            if ((ushort)*(UChar *)((long)cx + (long)(int)uVar13 * 2 + lVar3) <= (ushort)UVar2) {
              uVar7 = (ulong)uVar13;
              uVar13 = uVar12;
            }
            uVar12 = uVar13;
            uVar13 = uVar12 - (int)uVar7;
          } while (1 < (int)uVar13);
        }
        if (((int)uVar12 <= (int)uVar7) ||
           (*(UChar *)((long)cx + (long)(int)uVar7 * 2 + lVar3) != UVar2)) {
          uVar7 = 0xffffffff;
        }
        if ((int)uVar7 < 0) goto LAB_001b8284;
        uVar13 = *(uint *)((long)cx + uVar7 * 4 + uVar11 * 4 + (long)cx[6] + 4);
        iVar9 = iVar10;
      } while (uVar13 < 0x1000000);
      if (((uVar13 >> 0x1d & 1) == 0) &&
         ((0xfffdffff < firstCP - 0x110000U ||
          (0xffffe6ff < firstCP - 0xf900U || useFallback != '\0')) || 0x3fffffff < uVar13)) {
        local_44 = iVar10 + iVar8 + 2;
        local_40 = uVar13;
      }
LAB_001b8284:
      uVar13 = local_40;
      if (local_44 == 0) {
        return 0;
      }
    }
    else {
      if ((uVar13 >> 0x1d & 1) != 0) {
        return 0;
      }
      local_44 = 2;
      if ((firstCP - 0x110000U < 0xfffe0000 &&
          (firstCP - 0xf900U < 0xffffe700 && useFallback == '\0')) && uVar13 < 0x40000000) {
        return 0;
      }
    }
    iVar5 = 1;
    if (uVar13 != 0x80000001) {
      *pMatchValue = uVar13;
      iVar5 = local_44;
    }
  }
  return iVar5;
}

Assistant:

static int32_t
ucnv_extMatchFromU(const int32_t *cx,
                   UChar32 firstCP,
                   const UChar *pre, int32_t preLength,
                   const UChar *src, int32_t srcLength,
                   uint32_t *pMatchValue,
                   UBool useFallback, UBool flush) {
    const uint16_t *stage12, *stage3;
    const uint32_t *stage3b;

    const UChar *fromUTableUChars, *fromUSectionUChars;
    const uint32_t *fromUTableValues, *fromUSectionValues;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    UChar c;

    if(cx==NULL) {
        return 0; /* no extension data, no match */
    }

    /* trie lookup of firstCP */
    idx=firstCP>>10; /* stage 1 index */
    if(idx>=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH]) {
        return 0; /* the first code point is outside the trie */
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    idx=UCNV_EXT_FROM_U(stage12, stage3, idx, firstCP);

    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);
    value=stage3b[idx];
    if(value==0) {
        return 0;
    }

    /*
     * Tests for (value&UCNV_EXT_FROM_U_RESERVED_MASK)==0:
     * Do not interpret values with reserved bits used, for forward compatibility,
     * and do not even remember intermediate results with reserved bits used.
     */

    if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
        /* partial match, enter the loop below */
        idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);

        /* initialize */
        fromUTableUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar);
        fromUTableValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t);

        matchValue=0;
        i=j=matchLength=0;

        /* we must not remember fallback matches when not using fallbacks */

        /* match input units until there is a full match or the input is consumed */
        for(;;) {
            /* go to the next section */
            fromUSectionUChars=fromUTableUChars+idx;
            fromUSectionValues=fromUTableValues+idx;

            /* read first pair of the section */
            length=*fromUSectionUChars++;
            value=*fromUSectionValues++;
            if(value!=0 && extFromUUseMapping(useFallback, value, firstCP)) {
                /* remember longest match so far */
                matchValue=value;
                matchLength=2+i+j;
            }

            /* match pre[] then src[] */
            if(i<preLength) {
                c=pre[i++];
            } else if(j<srcLength) {
                c=src[j++];
            } else {
                /* all input consumed, partial match */
                if(flush || (length=(i+j))>UCNV_EXT_MAX_UCHARS) {
                    /*
                     * end of the entire input stream, stop with the longest match so far
                     * or: partial match must not be longer than UCNV_EXT_MAX_UCHARS
                     * because it must fit into state buffers
                     */
                    break;
                } else {
                    /* continue with more input next time */
                    return -(2+length);
                }
            }

            /* search for the current UChar */
            idx=ucnv_extFindFromU(fromUSectionUChars, length, c);
            if(idx<0) {
                /* no match here, stop with the longest match so far */
                break;
            } else {
                value=fromUSectionValues[idx];
                if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                    /* partial match, continue */
                    idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);
                } else {
                    if(extFromUUseMapping(useFallback, value, firstCP)) {
                        /* full match, stop with result */
                        matchValue=value;
                        matchLength=2+i+j;
                    } else {
                        /* full match on fallback not taken, stop with the longest match so far */
                    }
                    break;
                }
            }
        }

        if(matchLength==0) {
            /* no match at all */
            return 0;
        }
    } else /* result from firstCP trie lookup */ {
        if(extFromUUseMapping(useFallback, value, firstCP)) {
            /* full match, stop with result */
            matchValue=value;
            matchLength=2;
        } else {
            /* fallback not taken */
            return 0;
        }
    }

    /* return result */
    if(matchValue==UCNV_EXT_FROM_U_SUBCHAR1) {
        return 1; /* assert matchLength==2 */
    }

    *pMatchValue=matchValue;
    return matchLength;
}